

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

void cscal(int n,complex<float> ca,complex<float> *cx,int incx)

{
  ulong uVar1;
  bool bVar2;
  _ComplexT_conflict extraout_XMM0_Qa;
  _ComplexT_conflict extraout_XMM0_Qa_00;
  complex<float> local_30;
  complex<float> ca_local;
  
  if (0 < (int)cx && 0 < n) {
    if ((int)cx == 1) {
      uVar1 = (ulong)(uint)n;
      while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
        std::operator*(&local_30,(complex<float> *)ca._M_value);
        ((complex<float> *)ca._M_value)->_M_value = extraout_XMM0_Qa;
        ca._M_value = ca._M_value + 8;
      }
    }
    else {
      uVar1 = (ulong)(uint)n;
      while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
        std::operator*(&local_30,(complex<float> *)ca._M_value);
        ((complex<float> *)ca._M_value)->_M_value = extraout_XMM0_Qa_00;
        ca._M_value = ca._M_value + ((ulong)cx & 0xffffffff) * 8;
      }
    }
  }
  return;
}

Assistant:

void cscal ( int n, complex <float> ca, complex <float> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    CSCAL scales a vector by a constant.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> CA, the multiplier.
//
//    Input/output, complex <float> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = ca * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = ca * cx[i*incx];
    }
  }
  return;
}